

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O3

void __thiscall
FIX::DataDictionary::MessageFieldsOrderHolder::~MessageFieldsOrderHolder
          (MessageFieldsOrderHolder *this)

{
  pointer piVar1;
  
  piVar1 = (this->m_orderedFlds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->m_orderedFlds).super__Vector_base<int,_std::allocator<int>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  shared_array<int>::release(&(this->m_msgOrder).m_groupOrder);
  return;
}

Assistant:

~MessageFieldsOrderHolder() {}